

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O0

int read_asn1_length(uchar *data,size_t datalen,size_t *len)

{
  uint local_2c;
  int nextpos;
  uint lenlen;
  size_t *len_local;
  size_t datalen_local;
  uchar *data_local;
  
  if (datalen == 0) {
    data_local._4_4_ = -1;
  }
  else {
    *len = (ulong)*data;
    if (*len < 0x80) {
      local_2c = 0;
    }
    else {
      local_2c = (uint)*len & 0x7f;
      *len = (ulong)data[1];
      if (datalen < local_2c + 1) {
        return -1;
      }
      if (1 < local_2c) {
        *len = *len << 8;
        *len = (ulong)data[2] | *len;
      }
    }
    data_local._4_4_ = local_2c + 1;
    if ((2 < local_2c) || (datalen < (ulong)(local_2c + 1) + *len)) {
      data_local._4_4_ = -1;
    }
  }
  return data_local._4_4_;
}

Assistant:

static int
read_asn1_length(const unsigned char *data,
                 size_t datalen, size_t *len)
{
    unsigned int lenlen;
    int nextpos;

    if(datalen < 1) {
        return -1;
    }
    *len = data[0];

    if(*len >= 0x80) {
        lenlen = *len & 0x7F;
        *len = data[1];
        if(1 + lenlen > datalen) {
            return -1;
        }
        if(lenlen > 1) {
            *len <<= 8;
            *len |= data[2];
        }
    }
    else {
        lenlen = 0;
    }

    nextpos = 1 + lenlen;
    if(lenlen > 2 || 1 + lenlen + *len > datalen) {
        return -1;
    }

    return nextpos;
}